

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::add_child
          (tag_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *tag)

{
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  _Var1;
  exception_t<cfgfile::string_trait_t> *this_00;
  allocator local_163;
  allocator local_162;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_pred<cfgfile::tag_t<cfgfile::string_trait_t>::add_child(cfgfile::tag_t<cfgfile::string_trait_t>&)::_lambda(cfgfile::tag_t<cfgfile::string_trait_t>const*)_1_>>
                    ((this->m_child_tags).
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_child_tags).
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,tag);
  if (_Var1._M_current ==
      (this->m_child_tags).
      super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_160._M_dataplus._M_p = (pointer)tag;
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_equals_val<cfgfile::tag_t<cfgfile::string_trait_t>*const>>
                      ((this->m_child_tags).
                       super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (_Var1._M_current ==
        (this->m_child_tags).
        super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_160._M_dataplus._M_p = (pointer)tag;
      std::
      vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
      ::emplace_back<cfgfile::tag_t<cfgfile::string_trait_t>*>
                ((vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
                  *)&this->m_child_tags,(tag_t<cfgfile::string_trait_t> **)&local_160);
      tag->m_parent = this;
    }
    return;
  }
  this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_c0,"Tag with name \"",&local_161);
  std::__cxx11::string::string((string *)&local_a0,local_c0);
  std::operator+(&local_80,&local_a0,&tag->m_name);
  std::__cxx11::string::string(local_100,"\" already exists in parent tag \"",&local_162);
  std::__cxx11::string::string((string *)&local_e0,local_100);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_160,&local_60,&this->m_name);
  std::__cxx11::string::string(local_140,"\".",&local_163);
  std::__cxx11::string::string((string *)&local_120,local_140);
  std::operator+(&local_40,&local_160,&local_120);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_40);
  __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void add_child( tag_t< Trait > & tag )
	{
		if( std::find_if( m_child_tags.cbegin(), m_child_tags.cend(),
			[ &tag ] ( const tag_t< Trait > * t )
			{
				return ( tag.name() == t->name() );
			} ) != m_child_tags.cend() )
		{
			throw exception_t< Trait > (
				Trait::from_ascii( "Tag with name \"" ) +
				tag.name() +
				Trait::from_ascii( "\" already exists in parent tag \"" ) +
				this->name() +
				Trait::from_ascii( "\"." ) );
		}

		if( std::find( m_child_tags.cbegin(), m_child_tags.cend(), &tag ) ==
			m_child_tags.cend() )
		{
			m_child_tags.push_back( &tag );

			tag.set_parent( this );
		}
	}